

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QNetworkInterfacePrivate_*>::relocate
          (QArrayDataPointer<QNetworkInterfacePrivate_*> *this,qsizetype offset,
          QNetworkInterfacePrivate ***data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<QNetworkInterfacePrivate_*> *in_RDI;
  QNetworkInterfacePrivate ***unaff_retaddr;
  QNetworkInterfacePrivate **res;
  QNetworkInterfacePrivate **first;
  QArrayDataPointer<QNetworkInterfacePrivate_*> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QNetworkInterfacePrivate*,long_long>
            (first,(longlong)in_RDI,(QNetworkInterfacePrivate **)0x35f9d7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QNetworkInterfacePrivate*>,QNetworkInterfacePrivate*const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }